

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v6::internal::
          parse_arg_id<wchar_t,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  int arg_id;
  long lVar4;
  error_handler *begin_00;
  basic_string_view<wchar_t> arg_id_00;
  wchar_t *local_20;
  
  wVar3 = *begin;
  local_20 = begin;
  if ((wVar3 == L'}') || (wVar3 == L':')) {
    specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::on_dynamic_precision<fmt::v6::internal::auto_id>
              (&handler->handler->
                super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
              );
  }
  else if ((uint)(wVar3 + L'\xffffffd0') < 10) {
    begin_00 = (error_handler *)&local_20;
    arg_id = parse_nonnegative_int<wchar_t,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&,wchar_t>&>
                       ((wchar_t **)begin_00,end,handler);
    begin = (wchar_t *)begin_00;
    if ((local_20 == end) || ((*local_20 != L':' && (*local_20 != L'}')))) {
LAB_001d1f8a:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
    ::on_dynamic_precision<int>
              (&handler->handler->
                super_specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
               ,arg_id);
  }
  else {
    if ((wVar3 != L'_') && (0x19 < (uint)((wVar3 & 0xffffffdfU) - 0x41U))) goto LAB_001d1f8a;
    lVar1 = 4;
    do {
      lVar4 = lVar1;
      pwVar2 = (wchar_t *)((long)begin + lVar4);
      if (pwVar2 == end) break;
      wVar3 = *pwVar2;
      lVar1 = lVar4 + 4;
    } while ((((uint)(wVar3 + L'\xffffffd0') < 10) || (wVar3 == L'_')) ||
            ((uint)((wVar3 & 0xffffffdfU) - 0x41U) < 0x1a));
    arg_id_00.size_ = lVar4 >> 2;
    arg_id_00.data_ = begin;
    specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
    ::on_dynamic_precision<fmt::v6::basic_string_view<wchar_t>>
              ((specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                *)handler->handler,arg_id_00);
    local_20 = pwVar2;
  }
  return local_20;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}